

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>,std::shared_ptr<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
          (undefined8 *param_1,undefined8 param_2,undefined8 param_3,long *param_4,
          Type_Conversions_State *param_5)

{
  undefined8 *puVar1;
  shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> sVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  boxed_cast<chaiscript::Boxed_Value_const&>
            ((chaiscript *)&local_38,(Boxed_Value *)*param_4,param_5);
  boxed_cast<chaiscript::Boxed_Value_const&>
            ((chaiscript *)&local_28,(Boxed_Value *)(*param_4 + 0x10),param_5);
  *param_1 = 0;
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00321368;
  puVar1[3] = 0;
  puVar1[2] = local_38;
  puVar1[3] = uStack_30;
  puVar1[5] = 0;
  puVar1[4] = local_28;
  puVar1[5] = uStack_20;
  param_1[1] = puVar1;
  *param_1 = puVar1 + 2;
  sVar2.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar2.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)param_1;
  return (shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>)
         sVar2.
         super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }